

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O3

void display(void)

{
  (*glad_glClear)(0x4100);
  (*glad_glPushMatrix)();
  drawBallHow = DRAW_BALL_SHADOW;
  DrawBoingBall();
  DrawGrid();
  drawBallHow = DRAW_BALL;
  DrawBoingBall();
  (*glad_glPopMatrix)();
  (*glad_glFlush)();
  return;
}

Assistant:

void display(void)
{
   glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT );
   glPushMatrix();

   drawBallHow = DRAW_BALL_SHADOW;
   DrawBoingBall();

   DrawGrid();

   drawBallHow = DRAW_BALL;
   DrawBoingBall();

   glPopMatrix();
   glFlush();
}